

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O3

bool __thiscall kws::Parser::IsInUnion(Parser *this,size_t pos,char *buffer)

{
  pointer pcVar1;
  bool bVar2;
  char *pcVar3;
  size_t sVar4;
  char *__end;
  char *pos_00;
  string buf;
  undefined1 *local_70;
  char *local_68;
  undefined1 local_60 [16];
  string local_50;
  
  local_70 = local_60;
  pcVar1 = (this->m_BufferNoComment)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + (this->m_BufferNoComment)._M_string_length);
  pcVar3 = local_68;
  if (buffer != (char *)0x0) {
    strlen(buffer);
    std::__cxx11::string::_M_replace((ulong)&local_70,0,pcVar3,(ulong)buffer);
  }
  if ((pos == 0xffffffffffffffff) || (local_68 + -1 < pos)) {
    bVar2 = false;
  }
  else {
    bVar2 = false;
    pcVar3 = (char *)std::__cxx11::string::find((char *)&local_70,0x169524,0);
    if (pcVar3 != (char *)0xffffffffffffffff) {
      do {
        pos_00 = pcVar3;
        if (pcVar3 < local_68) {
          do {
            pos_00 = pcVar3;
            if (local_70[(long)pcVar3] == '{') break;
            pcVar3 = pcVar3 + 1;
            pos_00 = local_68;
          } while (local_68 != pcVar3);
        }
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"","");
        sVar4 = FindClosingChar(this,'{','}',(size_t)pos_00,true,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        bVar2 = pos_00 < pos && pos < sVar4;
      } while ((pos_00 >= pos || pos >= sVar4) &&
              (pcVar3 = (char *)std::__cxx11::string::find
                                          ((char *)&local_70,0x169524,(ulong)(pos_00 + 1)),
              pcVar3 != (char *)0xffffffffffffffff));
    }
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  return bVar2;
}

Assistant:

bool Parser::IsInUnion(size_t pos,const char* buffer) const
{
  std::string buf = m_BufferNoComment;
  if(buffer)
    {
    buf = buffer;
    }

  if((pos == std::string::npos) || pos > buf.size()-1)
    {
    return false;
    }

  size_t b = buf.find("union",0);
  while(b!=std::string::npos)
    {
    while(b<buf.size())
      {
      if(buf[b] == '{')
        {
        break;
        }
      b++;
      }

    size_t c=this->FindClosingChar('{','}',b,true);
    if(pos<c && pos>b)
      {
      return true;
      }
    b = buf.find("union",b+1);
    }
  return false;
}